

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_DrawSlabC(int dx,fixed_t v,int dy,fixed_t vi,BYTE *vptr,BYTE *p)

{
  BYTE BVar1;
  BYTE *pBVar2;
  ulong uVar3;
  BYTE *pBVar4;
  long lVar5;
  undefined1 auVar6 [16];
  
  pBVar2 = slabcolormap;
  if (dx < 1) {
    __assert_fail("dx > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_draw.cpp"
                  ,0x5dd,"void R_DrawSlabC(int, fixed_t, int, fixed_t, const BYTE *, BYTE *)");
  }
  lVar5 = (long)dc_pitch;
  switch(dx) {
  case 1:
    for (; 0 < dy; dy = dy + -1) {
      *p = pBVar2[vptr[v >> 0x10]];
      p = p + lVar5;
      v = v + vi;
    }
    break;
  case 2:
    pBVar4 = p + 1;
    for (; 0 < dy; dy = dy + -1) {
      BVar1 = pBVar2[vptr[v >> 0x10]];
      pBVar4[-1] = BVar1;
      *pBVar4 = BVar1;
      v = v + vi;
      pBVar4 = pBVar4 + lVar5;
    }
    break;
  case 3:
    pBVar4 = p + 2;
    for (; 0 < dy; dy = dy + -1) {
      BVar1 = pBVar2[vptr[v >> 0x10]];
      pBVar4[-2] = BVar1;
      pBVar4[-1] = BVar1;
      *pBVar4 = BVar1;
      v = v + vi;
      pBVar4 = pBVar4 + lVar5;
    }
    break;
  case 4:
    for (; 0 < dy; dy = dy + -1) {
      auVar6 = ZEXT216(CONCAT11(pBVar2[vptr[v >> 0x10]],pBVar2[vptr[v >> 0x10]]));
      auVar6 = pshuflw(auVar6,auVar6,0);
      *(int *)p = auVar6._0_4_;
      p = p + lVar5;
      v = v + vi;
    }
    break;
  default:
    for (; 0 < dy; dy = dy + -1) {
      BVar1 = pBVar2[vptr[v >> 0x10]];
      for (uVar3 = 0; (uint)dx != uVar3; uVar3 = uVar3 + 1) {
        p[uVar3] = BVar1;
      }
      p = p + lVar5;
      v = v + vi;
    }
  }
  return;
}

Assistant:

void R_DrawSlabC(int dx, fixed_t v, int dy, fixed_t vi, const BYTE *vptr, BYTE *p)
{
	int x;
	const BYTE *colormap = slabcolormap;
	int pitch = dc_pitch;

	assert(dx > 0);

	if (dx == 1)
	{
		while (dy > 0)
		{
			*p = colormap[vptr[v >> FRACBITS]];
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else if (dx == 2)
	{
		while (dy > 0)
		{
			BYTE color = colormap[vptr[v >> FRACBITS]];
			p[0] = color;
			p[1] = color;
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else if (dx == 3)
	{
		while (dy > 0)
		{
			BYTE color = colormap[vptr[v >> FRACBITS]];
			p[0] = color;
			p[1] = color;
			p[2] = color;
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else if (dx == 4)
	{
		while (dy > 0)
		{
			BYTE color = colormap[vptr[v >> FRACBITS]];
			p[0] = color;
			p[1] = color;
			p[2] = color;
			p[3] = color;
			p += pitch;
			v += vi;
			dy--;
		}
	}
	else while (dy > 0)
	{
		BYTE color = colormap[vptr[v >> FRACBITS]];
		// The optimizer will probably turn this into a memset call.
		// Since dx is not likely to be large, I'm not sure that's a good thing,
		// hence the alternatives above.
		for (x = 0; x < dx; x++)
		{
			p[x] = color;
		}
		p += pitch;
		v += vi;
		dy--;
	}
}